

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorHandling.cpp
# Opt level: O2

void llvm::report_fatal_error(Twine *Reason,bool GenCrashDiag)

{
  Twine::dump(Reason);
  Twine::dump(Reason);
  exit(1);
}

Assistant:

void llvm::report_fatal_error(const Twine &Reason, bool GenCrashDiag) {
  Reason.dump();
#if 0 // XXX BINARYEN
  llvm::fatal_error_handler_t handler = nullptr;
  void* handlerData = nullptr;
  {
    // Only acquire the mutex while reading the handler, so as not to invoke a
    // user-supplied callback under a lock.
#if LLVM_ENABLE_THREADS == 1
    std::lock_guard<std::mutex> Lock(ErrorHandlerMutex);
#endif
    handler = ErrorHandler;
    handlerData = ErrorHandlerUserData;
  }

  if (handler) {
    handler(handlerData, Reason.str(), GenCrashDiag);
  } else {
    // Blast the result out to stderr.  We don't try hard to make sure this
    // succeeds (e.g. handling EINTR) and we can't use errs() here because
    // raw ostreams can call report_fatal_error.
    SmallVector<char, 64> Buffer;
    raw_svector_ostream OS(Buffer);
    OS << "LLVM ERROR: " << Reason << "\n";
    ssize_t written = ::write(2, MessageStr.data(), MessageStr.size());
    StringRef MessageStr = OS.str();
    (void)written; // If something went wrong, we deliberately just give up.
  }

  // If we reached here, we are failing ungracefully. Run the interrupt handlers
  // to make sure any special cleanups get done, in particular that we remove
  // files registered with RemoveFileOnSignal.
  sys::RunInterruptHandlers();
#else
  Reason.dump();
#endif

  exit(1);
}